

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

int16_t mipsdsp_rndq15_mul_q15_q15(uint16_t a,uint16_t b,CPUMIPSState_conflict5 *env)

{
  undefined2 uStack_1a;
  uint32_t temp;
  CPUMIPSState_conflict5 *env_local;
  uint16_t b_local;
  uint16_t a_local;
  
  if ((a == 0x8000) && (b == 0x8000)) {
    uStack_1a = 0x7fff;
    set_DSPControl_overflow_flag(1,0x15,env);
  }
  else {
    uStack_1a = (int16_t)((uint)((int)(short)a * (int)(short)b * 2 + 0x8000) >> 0x10);
  }
  return uStack_1a;
}

Assistant:

static inline int16_t mipsdsp_rndq15_mul_q15_q15(uint16_t a, uint16_t b,
                                                 CPUMIPSState *env)
{
    uint32_t temp;

    if ((a == 0x8000) && (b == 0x8000)) {
        temp = 0x7FFF0000;
        set_DSPControl_overflow_flag(1, 21, env);
    } else {
        temp = ((int16_t)a * (int16_t)b) << 1;
        temp = temp + 0x00008000;
    }

    return (temp & 0xFFFF0000) >> 16;
}